

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subtype-exprs.h
# Opt level: O2

void __thiscall
wasm::SubtypingDiscoverer<NullFixer>::visitIf(SubtypingDiscoverer<NullFixer> *this,If *curr)

{
  if ((curr->ifFalse != (Expression *)0x0) &&
     ((curr->super_SpecificExpression<(wasm::Expression::Id)2>).super_Expression.type.id != 1)) {
    StringLowering::replaceNulls(wasm::Module*)::NullFixer::noteSubtype(wasm::Expression*,wasm::
    Expression__(this + -0x58,curr->ifTrue,(Expression *)curr);
    StringLowering::replaceNulls(wasm::Module*)::NullFixer::noteSubtype(wasm::Expression*,wasm::
    Expression__(this + -0x58,curr->ifFalse,(Expression *)curr);
    return;
  }
  return;
}

Assistant:

void visitIf(If* curr) {
    if (curr->ifFalse && curr->type != Type::unreachable) {
      self()->noteSubtype(curr->ifTrue, curr);
      self()->noteSubtype(curr->ifFalse, curr);
    }
  }